

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

int handle_connection(int sockfd,ptls_context_t *ctx,char *server_name,char *input_file,
                     ptls_handshake_properties_t *hsprop,int request_key_update,int keep_sender_open
                     )

{
  ulong *puVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ptls_t *tls;
  size_t sVar8;
  int *piVar9;
  ssize_t sVar10;
  void *input;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  uint __fd;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint8_t wbuf_small [32];
  timeval timeout;
  fd_set exceptfds;
  fd_set readfds;
  fd_set writefds;
  char bytebuf [16384];
  ptls_buffer_t local_4288;
  ptls_buffer_t local_4268;
  size_t local_4248;
  char *local_4240;
  int local_4234;
  ulong local_4230;
  ptls_buffer_t local_4228;
  uint64_t local_4200;
  ptls_context_t *local_41f8;
  char *local_41f0;
  size_t local_41e8 [4];
  timeval local_41c8;
  fd_set local_41b8;
  fd_set local_4138;
  fd_set local_40b8;
  ptls_buffer_t local_4038 [512];
  
  local_4234 = request_key_update;
  if (server_name == (char *)0x0) {
    tls = ptls_server_new(ctx);
  }
  else {
    tls = ptls_client_new(ctx);
  }
  local_4200 = (*ctx->get_time->cb)(ctx->get_time);
  local_4228.base = "";
  local_4228.capacity = 0;
  local_4228.off = 0;
  uVar14 = 0;
  local_4228._24_8_ = (ulong)(uint)local_4228._28_4_ << 0x20;
  local_4268.base = "";
  local_4268.capacity = 0;
  local_4268.off = 0;
  local_4268._24_8_ = (ulong)(uint)local_4268._28_4_ << 0x20;
  local_4288.base = "";
  local_4288.capacity = 0;
  local_4288.off = 0;
  local_4288._24_8_ = (ulong)(uint)local_4288._28_4_ << 0x20;
  fcntl(sockfd,4,0x800);
  local_41f8 = ctx;
  if (input_file == "is:benchmark") {
    iVar7 = ptls_is_server(tls);
    uVar14 = (ulong)((uint)(iVar7 != 0) * 2 - 2);
LAB_00107260:
    iVar7 = (int)uVar14;
    uVar4 = 0;
    if (server_name != (char *)0x0) {
      ptls_set_server_name(tls,server_name,0);
      uVar5 = ptls_handshake(tls,&local_4268,(void *)0x0,(size_t *)0x0,hsprop);
      uVar4 = 0x202;
      if (uVar5 != 0x202) {
        fprintf(_stderr,"ptls_handshake:%d\n",(ulong)uVar5);
        uVar11 = 1;
        goto LAB_00107ace;
      }
    }
    iVar6 = sockfd + 0x3f;
    if (-1 < sockfd) {
      iVar6 = sockfd;
    }
    uVar11 = 1L << ((byte)sockfd & 0x3f);
    iVar6 = iVar6 >> 6;
    local_4248 = 0;
    iVar13 = 0;
    local_4240 = input_file;
    local_41f0 = server_name;
    do {
      __fd = (uint)uVar14;
      uVar16 = 1L << ((byte)uVar14 & 0x3f);
      local_4230 = uVar14 >> 6;
      uVar5 = sockfd;
      if (sockfd < (int)__fd) {
        uVar5 = __fd;
      }
      uVar15 = (ulong)(uint)((int)local_4230 * 8);
      do {
        local_4138.fds_bits[0xe] = 0;
        local_4138.fds_bits[0xf] = 0;
        local_4138.fds_bits[0xc] = 0;
        local_4138.fds_bits[0xd] = 0;
        local_4138.fds_bits[10] = 0;
        local_4138.fds_bits[0xb] = 0;
        local_4138.fds_bits[8] = 0;
        local_4138.fds_bits[9] = 0;
        local_4138.fds_bits[6] = 0;
        local_4138.fds_bits[7] = 0;
        local_4138.fds_bits[4] = 0;
        local_4138.fds_bits[5] = 0;
        local_4138.fds_bits[2] = 0;
        local_4138.fds_bits[3] = 0;
        local_4138.fds_bits[0] = 0;
        local_4138.fds_bits[1] = 0;
        local_40b8.fds_bits[0] = 0;
        local_40b8.fds_bits[1] = 0;
        local_40b8.fds_bits[2] = 0;
        local_40b8.fds_bits[3] = 0;
        local_40b8.fds_bits[4] = 0;
        local_40b8.fds_bits[5] = 0;
        local_40b8.fds_bits[6] = 0;
        local_40b8.fds_bits[7] = 0;
        local_40b8.fds_bits[8] = 0;
        local_40b8.fds_bits[9] = 0;
        local_40b8.fds_bits[10] = 0;
        local_40b8.fds_bits[0xb] = 0;
        local_40b8.fds_bits[0xc] = 0;
        local_40b8.fds_bits[0xd] = 0;
        local_40b8.fds_bits[0xe] = 0;
        local_40b8.fds_bits[0xf] = 0;
        local_41b8.fds_bits[0] = 0;
        local_41b8.fds_bits[1] = 0;
        local_41b8.fds_bits[2] = 0;
        local_41b8.fds_bits[3] = 0;
        local_41b8.fds_bits[4] = 0;
        local_41b8.fds_bits[5] = 0;
        local_41b8.fds_bits[6] = 0;
        local_41b8.fds_bits[7] = 0;
        local_41b8.fds_bits[8] = 0;
        local_41b8.fds_bits[9] = 0;
        local_41b8.fds_bits[10] = 0;
        local_41b8.fds_bits[0xb] = 0;
        local_4138.fds_bits[iVar6] = local_4138.fds_bits[iVar6] | uVar11;
        local_41b8.fds_bits[0xc] = 0;
        local_41b8.fds_bits[0xd] = 0;
        local_41b8.fds_bits[0xe] = 0;
        local_41b8.fds_bits[0xf] = 0;
        if ((local_4268.off != 0) || (__fd == 0xfffffffe)) {
          local_40b8.fds_bits[iVar6] = local_40b8.fds_bits[iVar6] | uVar11;
        }
        local_41b8.fds_bits[iVar6] = local_41b8.fds_bits[iVar6] | uVar11;
        uVar12 = sockfd;
        if (-1 < (int)__fd) {
          puVar1 = (ulong *)((long)local_4138.fds_bits + uVar15);
          *puVar1 = *puVar1 | uVar16;
          puVar1 = (ulong *)((long)local_41b8.fds_bits + uVar15);
          *puVar1 = *puVar1 | uVar16;
          uVar12 = uVar5;
        }
        local_41c8.tv_sec = 0;
        if (local_4268.off == 0) {
          local_41c8.tv_sec = 0xe10;
        }
        local_41c8.tv_usec = 0;
        iVar7 = select(uVar12 + 1,&local_4138,&local_40b8,&local_41b8,&local_41c8);
      } while (iVar7 == -1);
      if (((local_4138.fds_bits[iVar6] & uVar11) == 0) &&
         ((local_41b8.fds_bits[iVar6] & uVar11) == 0)) {
LAB_0010766e:
        if ((local_4268.off == 0) || (iVar13 == 0)) {
          if (((int)__fd < 0) ||
             ((((ulong)local_4138.fds_bits[local_4230] >> (uVar14 & 0x3f) & 1) == 0 &&
              ((local_41b8.fds_bits[local_4230] & 1L << ((byte)uVar14 & 0x3f)) == 0)))) {
            if (__fd == 0xfffffffe) {
              if (local_4288.capacity < 0x4000) {
                uVar4 = ptls_buffer_reserve(&local_4288,0x4000 - local_4288.capacity);
                if (uVar4 != 0) {
                  bVar3 = true;
                  uVar14 = 0xfffffffe;
                  goto LAB_00107650;
                }
                memset(local_4288.base + local_4288.capacity,0,0x4000 - local_4288.capacity);
                uVar4 = 0;
              }
              local_4288.off = 0x4000;
              uVar14 = 0xfffffffe;
            }
          }
          else {
            uVar4 = ptls_buffer_reserve(&local_4288,0x4000);
            bVar3 = true;
            if (uVar4 != 0) goto LAB_00107650;
            do {
              sVar10 = read(__fd,local_4288.base + local_4288.off,0x4000);
              if (sVar10 != -1) break;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            if (sVar10 < 1) {
              if (sVar10 == 0 && local_4240 != (char *)0x0) {
                close(__fd);
                uVar14 = 0xffffffff;
              }
              else {
                uVar14 = (ulong)(-(uint)(sVar10 == 0) | __fd);
              }
            }
            else {
              local_4288.off = local_4288.off + sVar10;
            }
          }
        }
        if (local_4288.off == 0) {
LAB_001077da:
          if (local_4268.off != 0) {
            do {
              sVar8 = write(sockfd,local_4268.base,local_4268.off);
              if (sVar8 != 0xffffffffffffffff) goto LAB_00107811;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            if (*piVar9 != 0xb) {
LAB_00107811:
              if ((long)sVar8 < 1) goto LAB_00107912;
              shift_buffer(&local_4268,sVar8);
            }
          }
          bVar3 = false;
          if (((iVar13 == 1) && ((int)uVar14 == -1)) && (iVar13 = 2, keep_sender_open == 0)) {
            local_4038[0].base = (uint8_t *)local_41e8;
            local_4038[0].off = 0;
            local_4038[0].capacity = 0x20;
            local_4038[0]._24_8_ = local_4038[0]._24_8_ & 0xffffffff00000000;
            uVar4 = ptls_send_alert(tls,local_4038,'\x01','\0');
            if (uVar4 != 0) {
              fprintf(_stderr,"ptls_send_alert:%d\n",(ulong)uVar4);
            }
            if (local_4038[0].off != 0) {
              write(sockfd,local_4038[0].base,local_4038[0].off);
            }
            ptls_buffer__release_memory(local_4038);
            local_4038[0].off = 0;
            local_4038[0]._24_8_ = 0;
            local_4038[0].base = (uint8_t *)0x0;
            local_4038[0].capacity = 0;
            shutdown(sockfd,1);
            iVar13 = 2;
            bVar3 = false;
          }
        }
        else {
          if (iVar13 == 0) {
            if ((local_41f0 == (char *)0x0) ||
               (puVar1 = (hsprop->field_0).client.max_early_data_size, puVar1 == (ulong *)0x0)) {
              sVar8 = 0;
            }
            else {
              uVar16 = *puVar1;
              sVar8 = local_4288.off;
              if (uVar16 < local_4288.off) {
                sVar8 = uVar16;
              }
              sVar8 = sVar8 - local_4248;
            }
            bVar2 = true;
            if (sVar8 == 0) {
LAB_001077ca:
              bVar3 = false;
            }
            else {
              uVar4 = ptls_send(tls,&local_4268,local_4288.base,sVar8);
              if (uVar4 == 0) {
                local_4248 = local_4248 + sVar8;
                uVar4 = 0;
                goto LAB_001077ca;
              }
              bVar2 = false;
              fprintf(_stderr,"ptls_send(early_data):%d\n",(ulong)uVar4);
              bVar3 = true;
            }
            if (!bVar2) {
              iVar13 = 0;
              goto LAB_00107650;
            }
            goto LAB_001077da;
          }
          uVar4 = ptls_send(tls,&local_4268,local_4288.base,local_4288.off);
          if (uVar4 == 0) {
            local_4288.off = 0;
            uVar4 = 0;
            goto LAB_001077da;
          }
          fprintf(_stderr,"ptls_send(1rtt):%d\n",(ulong)uVar4);
LAB_00107912:
          bVar3 = true;
        }
      }
      else {
        do {
          sVar8 = read(sockfd,local_4038,0x4000);
          if (sVar8 != 0xffffffffffffffff) goto LAB_001074d5;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        if (*piVar9 == 0xb) {
          sVar8 = 0;
LAB_001074e1:
          local_41e8[0] = sVar8;
          if (sVar8 != 0) {
            lVar17 = 0;
            do {
              input = (void *)((long)&local_4038[0].base + lVar17);
              if (iVar13 == 0) {
                uVar4 = ptls_handshake(tls,&local_4268,input,local_41e8,hsprop);
                iVar13 = 0;
                if (uVar4 != 0x202) {
                  if (uVar4 != 0) {
                    handle_connection_cold_2();
                    bVar2 = false;
                    bVar3 = true;
                    iVar13 = 0;
                    goto LAB_0010764c;
                  }
                  iVar7 = ptls_is_server(tls);
                  if ((iVar7 == 0) &&
                     ((hsprop->field_0).client.early_data_acceptance ==
                      PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN)) {
                    __assert_fail("ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/cli.c"
                                  ,0x95,
                                  "int handle_connection(int, ptls_context_t *, const char *, const char *, ptls_handshake_properties_t *, int, int)"
                                 );
                  }
                  if ((hsprop->field_0).client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED) {
                    shift_buffer(&local_4288,local_4248);
                  }
                  uVar4 = 0;
                  if (local_4234 == 0) {
                    iVar13 = 1;
                  }
                  else {
                    ptls_update_key(tls,1);
                    iVar13 = 1;
                    uVar4 = 0;
                  }
                }
              }
              else {
                uVar4 = ptls_receive(tls,&local_4228,input,local_41e8);
                if (uVar4 != 0x202) {
                  if (uVar4 != 0) {
                    fprintf(_stderr,"ptls_receive:%d\n",(ulong)uVar4);
                    bVar2 = false;
                    bVar3 = true;
                    goto LAB_0010764c;
                  }
                  if (local_4228.off != 0) {
                    if (local_4240 != "is:benchmark") {
                      write(1,local_4228.base,local_4228.off);
                    }
                    local_4228.off = 0;
                  }
                  uVar4 = 0;
                }
              }
              lVar17 = lVar17 + local_41e8[0];
              local_41e8[0] = sVar8 - lVar17;
            } while (local_41e8[0] != 0);
          }
          bVar3 = false;
          bVar2 = true;
        }
        else {
LAB_001074d5:
          if (0 < (long)sVar8) goto LAB_001074e1;
          bVar3 = true;
          bVar2 = false;
        }
LAB_0010764c:
        if (bVar2) goto LAB_0010766e;
      }
LAB_00107650:
      iVar7 = (int)uVar14;
    } while (!bVar3);
    if (!bVar3) goto LAB_00107b63;
    uVar11 = (ulong)(uVar4 != 0);
    input_file = local_4240;
  }
  else {
    if (input_file == (char *)0x0) goto LAB_00107260;
    uVar4 = open(input_file,0);
    uVar14 = (ulong)uVar4;
    if (uVar4 != 0xffffffff) goto LAB_00107260;
    handle_connection_cold_1();
    iVar7 = -1;
    uVar11 = 1;
  }
LAB_00107ace:
  if (input_file == "is:benchmark") {
    handle_connection_cold_3();
  }
  if (sockfd != -1) {
    close(sockfd);
  }
  if (((input_file != (char *)0x0) && (input_file != "is:benchmark")) && (-1 < iVar7)) {
    close(iVar7);
  }
  ptls_buffer__release_memory(&local_4228);
  local_4228.off = 0;
  local_4228.is_allocated = 0;
  local_4228._28_4_ = 0;
  local_4228.base = (uint8_t *)0x0;
  local_4228.capacity = 0;
  ptls_buffer__release_memory(&local_4268);
  local_4268.off = 0;
  local_4268.is_allocated = 0;
  local_4268._28_4_ = 0;
  local_4268.base = (uint8_t *)0x0;
  local_4268.capacity = 0;
  ptls_buffer__release_memory(&local_4288);
  local_4288.off = 0;
  local_4288.is_allocated = 0;
  local_4288._28_4_ = 0;
  local_4288.base = (uint8_t *)0x0;
  local_4288.capacity = 0;
  ptls_free(tls);
LAB_00107b63:
  return (int)uVar11;
}

Assistant:

static int handle_connection(int sockfd, ptls_context_t *ctx, const char *server_name, const char *input_file,
                             ptls_handshake_properties_t *hsprop, int request_key_update, int keep_sender_open)
{
    static const int inputfd_is_benchmark = -2;

    ptls_t *tls = ptls_new(ctx, server_name == NULL);
    ptls_buffer_t rbuf, encbuf, ptbuf;
    enum { IN_HANDSHAKE, IN_1RTT, IN_SHUTDOWN } state = IN_HANDSHAKE;
    int inputfd = 0, ret = 0;
    size_t early_bytes_sent = 0;
    uint64_t data_received = 0;
    ssize_t ioret;

    uint64_t start_at = ctx->get_time->cb(ctx->get_time);

    ptls_buffer_init(&rbuf, "", 0);
    ptls_buffer_init(&encbuf, "", 0);
    ptls_buffer_init(&ptbuf, "", 0);

    fcntl(sockfd, F_SETFL, O_NONBLOCK);

    if (input_file == input_file_is_benchmark) {
        if (!ptls_is_server(tls))
            inputfd = inputfd_is_benchmark;
    } else if (input_file != NULL) {
        if ((inputfd = open(input_file, O_RDONLY)) == -1) {
            fprintf(stderr, "failed to open file:%s:%s\n", input_file, strerror(errno));
            ret = 1;
            goto Exit;
        }
    }
    if (server_name != NULL) {
        ptls_set_server_name(tls, server_name, 0);
        if ((ret = ptls_handshake(tls, &encbuf, NULL, NULL, hsprop)) != PTLS_ERROR_IN_PROGRESS) {
            fprintf(stderr, "ptls_handshake:%d\n", ret);
            ret = 1;
            goto Exit;
        }
    }

    while (1) {
        /* check if data is available */
        fd_set readfds, writefds, exceptfds;
        int maxfd = 0;
        struct timeval timeout;
        do {
            FD_ZERO(&readfds);
            FD_ZERO(&writefds);
            FD_ZERO(&exceptfds);
            FD_SET(sockfd, &readfds);
            if (encbuf.off != 0 || inputfd == inputfd_is_benchmark)
                FD_SET(sockfd, &writefds);
            FD_SET(sockfd, &exceptfds);
            maxfd = sockfd + 1;
            if (inputfd >= 0) {
                FD_SET(inputfd, &readfds);
                FD_SET(inputfd, &exceptfds);
                if (maxfd <= inputfd)
                    maxfd = inputfd + 1;
            }
            timeout.tv_sec = encbuf.off != 0 ? 0 : 3600;
            timeout.tv_usec = 0;
        } while (select(maxfd, &readfds, &writefds, &exceptfds, &timeout) == -1);

        /* consume incoming messages */
        if (FD_ISSET(sockfd, &readfds) || FD_ISSET(sockfd, &exceptfds)) {
            char bytebuf[16384];
            size_t off = 0, leftlen;
            while ((ioret = read(sockfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
                ioret = 0;
            } else if (ioret <= 0) {
                goto Exit;
            }
            while ((leftlen = ioret - off) != 0) {
                if (state == IN_HANDSHAKE) {
                    if ((ret = ptls_handshake(tls, &encbuf, bytebuf + off, &leftlen, hsprop)) == 0) {
                        state = IN_1RTT;
                        assert(ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
                        /* release data sent as early-data, if server accepted it */
                        if (hsprop->client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED)
                            shift_buffer(&ptbuf, early_bytes_sent);
                        if (request_key_update)
                            ptls_update_key(tls, 1);
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        if (encbuf.off != 0)
                            (void)write(sockfd, encbuf.base, encbuf.off);
                        fprintf(stderr, "ptls_handshake:%d\n", ret);
                        goto Exit;
                    }
                } else {
                    if ((ret = ptls_receive(tls, &rbuf, bytebuf + off, &leftlen)) == 0) {
                        if (rbuf.off != 0) {
                            data_received += rbuf.off;
                            if (input_file != input_file_is_benchmark)
                                write(1, rbuf.base, rbuf.off);
                            rbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        fprintf(stderr, "ptls_receive:%d\n", ret);
                        goto Exit;
                    }
                }
                off += leftlen;
            }
        }

        /* encrypt data to send, if any is available */
        if (encbuf.off == 0 || state == IN_HANDSHAKE) {
            static const size_t block_size = 16384;
            if (inputfd >= 0 && (FD_ISSET(inputfd, &readfds) || FD_ISSET(inputfd, &exceptfds))) {
                if ((ret = ptls_buffer_reserve(&ptbuf, block_size)) != 0)
                    goto Exit;
                while ((ioret = read(inputfd, ptbuf.base + ptbuf.off, block_size)) == -1 && errno == EINTR)
                    ;
                if (ioret > 0) {
                    ptbuf.off += ioret;
                } else if (ioret == 0) {
                    /* closed */
                    if (input_file != NULL)
                        close(inputfd);
                    inputfd = -1;
                }
            } else if (inputfd == inputfd_is_benchmark) {
                if (ptbuf.capacity < block_size) {
                    if ((ret = ptls_buffer_reserve(&ptbuf, block_size - ptbuf.capacity)) != 0)
                        goto Exit;
                    memset(ptbuf.base + ptbuf.capacity, 0, block_size - ptbuf.capacity);
                }
                ptbuf.off = block_size;
            }
        }
        if (ptbuf.off != 0) {
            if (state == IN_HANDSHAKE) {
                size_t send_amount = 0;
                if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
                    size_t max_can_be_sent = *hsprop->client.max_early_data_size;
                    if (max_can_be_sent > ptbuf.off)
                        max_can_be_sent = ptbuf.off;
                    send_amount = max_can_be_sent - early_bytes_sent;
                }
                if (send_amount != 0) {
                    if ((ret = ptls_send(tls, &encbuf, ptbuf.base, send_amount)) != 0) {
                        fprintf(stderr, "ptls_send(early_data):%d\n", ret);
                        goto Exit;
                    }
                    early_bytes_sent += send_amount;
                }
            } else {
                if ((ret = ptls_send(tls, &encbuf, ptbuf.base, ptbuf.off)) != 0) {
                    fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                    goto Exit;
                }
                ptbuf.off = 0;
            }
        }

        /* send any data */
        if (encbuf.off != 0) {
            while ((ioret = write(sockfd, encbuf.base, encbuf.off)) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
            } else if (ioret <= 0) {
                goto Exit;
            } else {
                shift_buffer(&encbuf, ioret);
            }
        }

        /* close the sender side when necessary */
        if (state == IN_1RTT && inputfd == -1) {
            if (!keep_sender_open) {
                ptls_buffer_t wbuf;
                uint8_t wbuf_small[32];
                ptls_buffer_init(&wbuf, wbuf_small, sizeof(wbuf_small));
                if ((ret = ptls_send_alert(tls, &wbuf, PTLS_ALERT_LEVEL_WARNING, PTLS_ALERT_CLOSE_NOTIFY)) != 0) {
                    fprintf(stderr, "ptls_send_alert:%d\n", ret);
                }
                if (wbuf.off != 0)
                    (void)write(sockfd, wbuf.base, wbuf.off);
                ptls_buffer_dispose(&wbuf);
                shutdown(sockfd, SHUT_WR);
            }
            state = IN_SHUTDOWN;
        }
    }

Exit:
    if (input_file == input_file_is_benchmark) {
        double elapsed = (ctx->get_time->cb(ctx->get_time) - start_at) / 1000.0;
        ptls_cipher_suite_t *cipher_suite = ptls_get_cipher(tls);
        fprintf(stderr, "received %" PRIu64 " bytes in %.3f seconds (%f.3Mbps); %s\n", data_received, elapsed,
                data_received * 8 / elapsed / 1000 / 1000, cipher_suite != NULL ? cipher_suite->aead->name : "unknown cipher");
    }

    if (sockfd != -1)
        close(sockfd);
    if (input_file != NULL && input_file != input_file_is_benchmark && inputfd >= 0)
        close(inputfd);
    ptls_buffer_dispose(&rbuf);
    ptls_buffer_dispose(&encbuf);
    ptls_buffer_dispose(&ptbuf);
    ptls_free(tls);

    return ret != 0;
}